

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::insert_attribute_after(xml_node *this,char_t *name_,xml_attribute *attr)

{
  xml_node_struct *node;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  uint uVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *pxVar5;
  xml_attribute a;
  xml_attribute local_30;
  xml_attribute local_28;
  
  node = this->_root;
  if (((node != (xml_node_struct *)0x0) &&
      (((uVar3 = (uint)node->header & 0xf, uVar3 == 2 || (uVar3 == 7)) &&
       (attr->_attr != (xml_attribute_struct *)0x0)))) &&
     (bVar2 = impl::anon_unknown_0::is_attribute_of(attr->_attr,node), bVar2)) {
    pxVar4 = impl::anon_unknown_0::allocate_attribute
                       (*(xml_allocator **)((long)node - (node->header >> 8)));
    xml_attribute::xml_attribute(&local_28,pxVar4);
    if (local_28._attr != (xml_attribute_struct *)0x0) {
      pxVar4 = attr->_attr;
      pxVar1 = pxVar4->next_attribute;
      pxVar5 = pxVar1;
      if (pxVar1 == (xml_attribute_struct *)0x0) {
        pxVar5 = this->_root->first_attribute;
      }
      pxVar5->prev_attribute_c = local_28._attr;
      (local_28._attr)->next_attribute = pxVar1;
      (local_28._attr)->prev_attribute_c = pxVar4;
      pxVar4->next_attribute = local_28._attr;
      xml_attribute::set_name(&local_28,name_);
      return (xml_attribute)local_28._attr;
    }
  }
  xml_attribute::xml_attribute(&local_30);
  return (xml_attribute)local_30._attr;
}

Assistant:

PUGI_IMPL_FN xml_node_type xml_node::type() const
	{
		return _root ? PUGI_IMPL_NODETYPE(_root) : node_null;
	}